

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_protocol_connecting(connectdata *conn,_Bool *done)

{
  _func_CURLcode_connectdata_ptr__Bool_ptr *UNRECOVERED_JUMPTABLE;
  CURLcode CVar1;
  
  if ((conn != (connectdata *)0x0) &&
     (UNRECOVERED_JUMPTABLE = conn->handler->connecting,
     UNRECOVERED_JUMPTABLE != (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0)) {
    *done = false;
    CVar1 = (*UNRECOVERED_JUMPTABLE)(conn,done);
    return CVar1;
  }
  *done = true;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_protocol_connecting(struct connectdata *conn,
                                  bool *done)
{
  CURLcode result = CURLE_OK;

  if(conn && conn->handler->connecting) {
    *done = FALSE;
    result = conn->handler->connecting(conn, done);
  }
  else
    *done = TRUE;

  return result;
}